

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O1

void png_set_sCAL_fixed(png_const_structrp png_ptr,png_inforp info_ptr,int unit,
                       png_fixed_point width,png_fixed_point height)

{
  char *warning_message;
  char sheight [18];
  char swidth [18];
  char acStack_68 [32];
  char local_48 [24];
  
  if (width < 1) {
    warning_message = "Invalid sCAL width ignored";
  }
  else {
    if (0 < height) {
      png_ascii_from_fixed(png_ptr,local_48,0x12,width);
      png_ascii_from_fixed(png_ptr,acStack_68,0x12,height);
      png_set_sCAL_s(png_ptr,info_ptr,unit,local_48,acStack_68);
      return;
    }
    warning_message = "Invalid sCAL height ignored";
  }
  png_warning(png_ptr,warning_message);
  return;
}

Assistant:

void PNGAPI
png_set_sCAL_fixed(png_const_structrp png_ptr, png_inforp info_ptr, int unit,
    png_fixed_point width, png_fixed_point height)
{
   png_debug1(1, "in %s storage function", "sCAL");

   /* Check the arguments. */
   if (width <= 0)
      png_warning(png_ptr, "Invalid sCAL width ignored");

   else if (height <= 0)
      png_warning(png_ptr, "Invalid sCAL height ignored");

   else
   {
      /* Convert 'width' and 'height' to ASCII. */
      char swidth[PNG_sCAL_MAX_DIGITS+1];
      char sheight[PNG_sCAL_MAX_DIGITS+1];

      png_ascii_from_fixed(png_ptr, swidth, (sizeof swidth), width);
      png_ascii_from_fixed(png_ptr, sheight, (sizeof sheight), height);

      png_set_sCAL_s(png_ptr, info_ptr, unit, swidth, sheight);
   }
}